

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_open(ion_bpp_open_t info,ion_bpp_handle_t *handle)

{
  int iVar1;
  undefined8 *puVar2;
  ion_boolean_t iVar3;
  ion_err_t iVar4;
  ion_bpp_err_t iVar5;
  undefined8 *__ptr;
  void *pvVar6;
  void *pvVar7;
  ion_file_handle_t pFVar8;
  ion_file_offset_t iVar9;
  long lVar10;
  int iVar11;
  size_t __size;
  bool bVar12;
  ion_bpp_buffer_t *piStack_38;
  
  iVar5 = bErrSectorSize;
  if (((undefined1  [32])info & (undefined1  [32])0x3) == (undefined1  [32])0x0 &&
      199 < info.sectorSize) {
    iVar1 = (int)info.sectorSize;
    iVar11 = (int)((ulong)(long)(iVar1 + -0x27) / ((long)info.keySize + 0x10U));
    if (5 < iVar11) {
      __ptr = (undefined8 *)calloc(1,200);
      if (__ptr == (undefined8 *)0x0) {
        iVar5 = bErrMemory;
        if (bErrLineNo == 0) {
          bErrLineNo = 0x3a0;
        }
      }
      else {
        *(int *)(__ptr + 1) = info.keySize;
        *(ion_bpp_bool_t *)((long)__ptr + 0xc) = info.dupKeys;
        *(int *)(__ptr + 2) = iVar1;
        __ptr[3] = info.comp;
        *(int *)((long)__ptr + 0xbc) = info.keySize + 0x10;
        *(int *)(__ptr + 0x17) = iVar11;
        pvVar6 = calloc(7,0x28);
        __ptr[0xe] = pvVar6;
        if (pvVar6 == (void *)0x0) {
          iVar5 = bErrMemory;
          if (bErrLineNo == 0) {
            bErrLineNo = 0x3b6;
          }
        }
        else {
          __size = (size_t)(iVar1 * 0xd + (info.keySize + 0x10) * 2);
          pvVar7 = malloc(__size);
          __ptr[0xf] = pvVar7;
          if (pvVar7 == (void *)0x0) {
            iVar5 = bErrMemory;
            if (bErrLineNo == 0) {
              bErrLineNo = 0x3c4;
            }
          }
          else {
            for (lVar10 = 0; lVar10 < (long)__size; lVar10 = lVar10 + 1) {
              *(undefined1 *)((long)pvVar7 + lVar10) = 0;
            }
            __ptr[9] = pvVar6;
            __ptr[10] = (long)pvVar6 + 0xf0;
            iVar11 = 7;
            puVar2 = (undefined8 *)pvVar6;
            while( true ) {
              bVar12 = iVar11 == 0;
              iVar11 = iVar11 + -1;
              if (bVar12) break;
              *puVar2 = puVar2 + 5;
              puVar2[1] = puVar2 + -5;
              puVar2[4] = 0;
              puVar2[3] = pvVar7;
              pvVar7 = (void *)((long)pvVar7 + (long)iVar1);
              puVar2 = puVar2 + 5;
            }
            *(undefined8 **)((long)pvVar6 + 8) = __ptr + 9;
            *(undefined8 **)((long)pvVar6 + 0xf0) = __ptr + 9;
            __ptr[7] = pvVar7;
            __ptr[0x13] = ((long)(info.sectorSize * 0x300000000) >> 0x20) + (long)pvVar7;
            iVar3 = ion_fexists(info.iName);
            pFVar8 = ion_fopen(info.iName);
            *__ptr = pFVar8;
            if (iVar3 == '\0') {
              if (pFVar8 == (ion_file_handle_t)0x0) {
                free(__ptr);
                return bErrFileNotOpen;
              }
              memset((void *)__ptr[7],0,(long)*(int *)(__ptr + 2) * 3);
              *(ushort *)__ptr[7] = *(ushort *)__ptr[7] | 1;
              __ptr[0x18] = (long)*(int *)(__ptr + 2) * 3;
              *(undefined4 *)((long)__ptr + 0x44) = 1;
              flushAll(__ptr);
            }
            else {
              iVar5 = readDisk(__ptr,0,&piStack_38);
              if (iVar5 != bErrOk) {
                return iVar5;
              }
              iVar4 = ion_fseek((ion_file_handle_t)*__ptr,0,2);
              if (iVar4 != '\0') {
                if (bErrLineNo != 0) {
                  return bErrIO;
                }
                bErrLineNo = 0x3f1;
                return bErrIO;
              }
              iVar9 = ion_ftell((ion_file_handle_t)*__ptr);
              __ptr[0x18] = iVar9;
              if (iVar9 == -1) {
                if (bErrLineNo != 0) {
                  return bErrIO;
                }
                bErrLineNo = 0x3f5;
                return bErrIO;
              }
            }
            *handle = __ptr;
            iVar5 = bErrOk;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

ion_bpp_err_t
b_open(
	ion_bpp_open_t		info,
	ion_bpp_handle_t	*handle
) {
	ion_bpp_h_node_t	*h;
	ion_bpp_err_t		rc;			/* return code */
	int					bufCt;	/* number of tmp buffers */
	ion_bpp_buffer_t	*buf;				/* buffer */
	int					maxCt;	/* maximum number of keys in a node */
	ion_bpp_buffer_t	*root;
	int					i;
	ion_bpp_node_t		*p;

	if ((info.sectorSize < sizeof(ion_bpp_h_node_t)) || (0 != info.sectorSize % 4)) {
		return bErrSectorSize;
	}

	/* determine sizes and offsets */
	/* leaf/n, prev, next, [childLT,key,rec]... childGE */
	/* ensure that there are at least 3 children/parent for gather/scatter */
	maxCt	= info.sectorSize - (sizeof(ion_bpp_node_t) - sizeof(ion_bpp_key_t));
	maxCt	/= sizeof(ion_bpp_address_t) + info.keySize + sizeof(ion_bpp_external_address_t);

	if (maxCt < 6) {
		return bErrSectorSize;
	}

	/* copy parms to ion_bpp_h_node_t */
	if ((h = calloc(1, sizeof(ion_bpp_h_node_t))) == NULL) {
		return error(bErrMemory);
	}

	h->keySize		= info.keySize;
	h->dupKeys		= info.dupKeys;
	h->sectorSize	= info.sectorSize;
	h->comp			= info.comp;

	/* childLT, key, rec */
	h->ks			= sizeof(ion_bpp_address_t) + h->keySize + sizeof(ion_bpp_external_address_t);
	h->maxCt		= maxCt;

	/* Allocate buflist.
	 * During insert/delete, need simultaneous access to 7 buffers:
	 *  - 4 adjacent child bufs
	 *  - 1 parent buf
	 *  - 1 next sequential link
	 *  - 1 lastGE
	*/
	bufCt			= 7;

	if ((h->malloc1 = calloc(bufCt, sizeof(ion_bpp_buffer_t))) == NULL) {
		return error(bErrMemory);
	}

	buf = h->malloc1;

	/*
	 * Allocate bufs.
	 * We need space for the following:
	 *  - bufCt buffers, of size sectorSize
	 *  - 1 buffer for root, of size 3*sectorSize
	 *  - 1 buffer for gbuf, size 3*sectorsize + 2 extra keys
	 *	to allow for LT pointers in last 2 nodes when gathering 3 full nodes
	*/
	if ((h->malloc2 = malloc((bufCt + 6) * h->sectorSize + 2 * h->ks)) == NULL) {
		return error(bErrMemory);
	}

	for (i = 0; i < (bufCt + 6) * h->sectorSize + 2 * h->ks; i++) {
		((char *) h->malloc2)[i] = 0;
	}

	p				= h->malloc2;

	/* initialize buflist */
	h->bufList.next = buf;
	h->bufList.prev = buf + (bufCt - 1);

	for (i = 0; i < bufCt; i++) {
		buf->next		= buf + 1;
		buf->prev		= buf - 1;
		buf->modified	= boolean_false;
		buf->valid		= boolean_false;
		buf->p			= p;
		p				= (ion_bpp_node_t *) ((char *) p + h->sectorSize);
		buf++;
	}

	h->bufList.next->prev	= &h->bufList;
	h->bufList.prev->next	= &h->bufList;

	/* initialize root */
	root					= &h->root;
	root->p					= p;
	p						= (ion_bpp_node_t *) ((char *) p + 3 * h->sectorSize);
	h->gbuf.p				= p;/* done last to include extra 2 keys */

	h->curBuf				= NULL;
	h->curKey				= NULL;

	/* initialize root */
	if (ion_fexists(info.iName)) {
		/* open an existing database */
		h->fp = ion_fopen(info.iName);

		if ((rc = readDisk(h, 0, &root)) != 0) {
			return rc;
		}

		if (ion_fseek(h->fp, 0, ION_FILE_END)) {
			return error(bErrIO);
		}

		if ((h->nextFreeAdr = ion_ftell(h->fp)) == -1) {
			return error(bErrIO);
		}
	}

#if defined(ARDUINO)
	else if (NULL != (h->fp = ion_fopen(info.iName)).file) {
#else
	else if (NULL != (h->fp = ion_fopen(info.iName))) {
#endif
		/* initialize root */
		memset(root->p, 0, 3 * h->sectorSize);
		leaf(root)		= 1;
		h->nextFreeAdr	= 3 * h->sectorSize;
		root->modified	= 1;
		flushAll(h);
	}